

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash-stringify-walker.cpp
# Opt level: O3

size_t __thiscall wasm::StringifyHasher::operator()(StringifyHasher *this,Expression *curr)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  uVar1 = (ulong)curr->_id;
  if (uVar1 < 0x36) {
    if ((0x3000000000000aU >> (uVar1 & 0x3f) & 1) != 0) {
      sVar2 = ExpressionAnalyzer::hash(curr);
      return sVar2;
    }
    if (uVar1 == 2) {
      sVar2 = ExpressionAnalyzer::hash((Expression *)curr[1].type.id);
      sVar4 = sVar2 + 0x9e3779b97f4a9c15 ^ 2;
      if (*(Expression **)(curr + 2) != (Expression *)0x0) {
        sVar3 = ExpressionAnalyzer::hash(*(Expression **)(curr + 2));
        sVar4 = sVar4 ^ (sVar2 + 0x9e3779b97f4a9c15 >> 4) + 0x9e3779b97f4a7c15 + sVar4 * 0x1000 +
                        sVar3;
      }
      return sVar4;
    }
  }
  sVar2 = ExpressionAnalyzer::shallowHash(curr);
  return sVar2;
}

Assistant:

size_t StringifyHasher::operator()(Expression* curr) const {
  if (Properties::isControlFlowStructure(curr)) {
    if (auto* iff = curr->dynCast<If>()) {
      size_t digest = wasm::hash(iff->_id);
      rehash(digest, ExpressionAnalyzer::hash(iff->ifTrue));
      if (iff->ifFalse) {
        rehash(digest, ExpressionAnalyzer::hash(iff->ifFalse));
      }
      return digest;
    }

    return ExpressionAnalyzer::hash(curr);
  }

  return ExpressionAnalyzer::shallowHash(curr);
}